

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_d0;
  int *local_b8;
  QWindow *local_b0;
  unsigned_long local_a8;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_a0;
  QPointingDevice *local_98;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_90;
  qreal local_88;
  qreal local_80;
  qreal local_78;
  qreal local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,
               args_12);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
  }
  else {
    memcpy(&local_d0,&DAT_0068f228,0x98);
    local_d0.type = Tablet;
    local_d0.flags = 0;
    local_d0.eventAccepted = true;
    if (args == (QWindow *)0x0) {
      local_d0.type = Tablet;
      local_d0.flags = 2;
      local_b8 = (int *)0x0;
    }
    else {
      local_b8 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
    }
    local_d0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d90b0;
    local_48 = args_10;
    local_b0 = args;
    local_a8 = args_1;
    local_a0.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         (QFlagsStorage<Qt::KeyboardModifier>)
         args_12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
         super_QFlagsStorage<Qt::KeyboardModifier>.i;
    local_98 = args_4;
    local_90.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         (QFlagsStorage<Qt::MouseButton>)
         args_5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i
    ;
    local_88 = args_2.xp;
    local_80 = args_2.yp;
    local_78 = args_3.xp;
    local_70 = args_3.yp;
    local_68 = args_6;
    local_60 = args_7;
    local_58 = args_8;
    local_50 = args_9;
    local_40 = args_11;
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent(&local_d0);
      uVar4 = local_d0.eventAccepted;
    }
    else {
      iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&local_d0);
      uVar4 = local_d0.eventAccepted;
      if ((char)iVar3 == '\0') {
        uVar4 = 0;
      }
    }
    local_d0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
    if (local_b8 != (int *)0x0) {
      LOCK();
      *local_b8 = *local_b8 + -1;
      UNLOCK();
      if (*local_b8 == 0) {
        piVar5 = local_b8;
        if (local_b8 == (int *)0x0) {
          piVar5 = (int *)0x0;
        }
        operator_delete(piVar5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}